

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNA.cpp
# Opt level: O0

unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_> __thiscall
Storage::State::SNA::load(SNA *this,string *file_name)

{
  unique_ptr<Reflection::Struct,std::default_delete<Reflection::Struct>> *this_00;
  bool bVar1;
  uint8_t uVar2;
  byte bVar3;
  uint16_t uVar4;
  stat *psVar5;
  pointer pTVar6;
  State *this_01;
  undefined8 uVar7;
  undefined1 local_148 [37];
  uint8_t r;
  uint8_t iff;
  uint8_t i;
  State *local_120;
  State *state;
  __single_object result;
  undefined1 local_100 [8];
  FileHolder file;
  string *file_name_local;
  
  file.file_access_mutex_.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)file_name;
  FileHolder::FileHolder((FileHolder *)local_100,file_name,ReadWrite);
  psVar5 = FileHolder::stats((FileHolder *)local_100);
  if (psVar5->st_size == 0xc01b) {
    std::make_unique<Analyser::Static::ZXSpectrum::Target>();
    pTVar6 = std::
             unique_ptr<Analyser::Static::ZXSpectrum::Target,_std::default_delete<Analyser::Static::ZXSpectrum::Target>_>
             ::operator->((unique_ptr<Analyser::Static::ZXSpectrum::Target,_std::default_delete<Analyser::Static::ZXSpectrum::Target>_>
                           *)&state);
    pTVar6->model = FortyEightK;
    this_01 = (State *)operator_new(0xe0);
    Sinclair::ZXSpectrum::State::State(this_01);
    this_00 = (unique_ptr<Reflection::Struct,std::default_delete<Reflection::Struct>> *)
              (local_148 + 0x20);
    local_120 = this_01;
    std::unique_ptr<Reflection::Struct,std::default_delete<Reflection::Struct>>::
    unique_ptr<std::default_delete<Reflection::Struct>,void>(this_00,(pointer)this_01);
    pTVar6 = std::
             unique_ptr<Analyser::Static::ZXSpectrum::Target,_std::default_delete<Analyser::Static::ZXSpectrum::Target>_>
             ::operator->((unique_ptr<Analyser::Static::ZXSpectrum::Target,_std::default_delete<Analyser::Static::ZXSpectrum::Target>_>
                           *)&state);
    std::unique_ptr<Reflection::Struct,_std::default_delete<Reflection::Struct>_>::operator=
              (&(pTVar6->super_Target).state,
               (unique_ptr<Reflection::Struct,_std::default_delete<Reflection::Struct>_> *)this_00);
    std::unique_ptr<Reflection::Struct,_std::default_delete<Reflection::Struct>_>::~unique_ptr
              ((unique_ptr<Reflection::Struct,_std::default_delete<Reflection::Struct>_> *)this_00);
    local_148[0x1f] = FileHolder::get8((FileHolder *)local_100);
    uVar4 = FileHolder::get16le((FileHolder *)local_100);
    (local_120->z80).registers.hl_dash = uVar4;
    uVar4 = FileHolder::get16le((FileHolder *)local_100);
    (local_120->z80).registers.de_dash = uVar4;
    uVar4 = FileHolder::get16le((FileHolder *)local_100);
    (local_120->z80).registers.bc_dash = uVar4;
    uVar4 = FileHolder::get16le((FileHolder *)local_100);
    (local_120->z80).registers.af_dash = uVar4;
    uVar4 = FileHolder::get16le((FileHolder *)local_100);
    (local_120->z80).registers.hl = uVar4;
    uVar4 = FileHolder::get16le((FileHolder *)local_100);
    (local_120->z80).registers.de = uVar4;
    uVar4 = FileHolder::get16le((FileHolder *)local_100);
    (local_120->z80).registers.bc = uVar4;
    uVar4 = FileHolder::get16le((FileHolder *)local_100);
    (local_120->z80).registers.iy = uVar4;
    uVar4 = FileHolder::get16le((FileHolder *)local_100);
    (local_120->z80).registers.ix = uVar4;
    local_148[0x1e] = FileHolder::get8((FileHolder *)local_100);
    bVar1 = SUB41(((byte)local_148[0x1e] & 4) >> 2,0);
    (local_120->z80).registers.iff2 = bVar1;
    (local_120->z80).registers.iff1 = bVar1;
    local_148[0x1d] = FileHolder::get8((FileHolder *)local_100);
    (local_120->z80).registers.ir = CONCAT11(local_148[0x1f],local_148[0x1d]);
    uVar2 = FileHolder::get8((FileHolder *)local_100);
    (local_120->z80).registers.flags = uVar2;
    uVar2 = FileHolder::get8((FileHolder *)local_100);
    (local_120->z80).registers.a = uVar2;
    uVar4 = FileHolder::get16le((FileHolder *)local_100);
    (local_120->z80).registers.stack_pointer = uVar4;
    bVar3 = FileHolder::get8((FileHolder *)local_100);
    uVar7 = 0;
    (local_120->z80).registers.interrupt_mode = (uint)bVar3;
    uVar2 = FileHolder::get8((FileHolder *)local_100);
    (local_120->video).border_colour = uVar2;
    FileHolder::read((FileHolder *)local_148,(int)local_100,(void *)0xc000,
                     CONCAT71((int7)((ulong)uVar7 >> 8),uVar2));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&local_120->ram,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_148);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_148);
    (local_120->z80).registers.program_counter = 0x1d83;
    std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>::
    unique_ptr<Analyser::Static::ZXSpectrum::Target,std::default_delete<Analyser::Static::ZXSpectrum::Target>,void>
              ((unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>> *
               )this,(unique_ptr<Analyser::Static::ZXSpectrum::Target,_std::default_delete<Analyser::Static::ZXSpectrum::Target>_>
                      *)&state);
    result._M_t.
    super___uniq_ptr_impl<Analyser::Static::ZXSpectrum::Target,_std::default_delete<Analyser::Static::ZXSpectrum::Target>_>
    ._M_t.
    super__Tuple_impl<0UL,_Analyser::Static::ZXSpectrum::Target_*,_std::default_delete<Analyser::Static::ZXSpectrum::Target>_>
    .super__Head_base<0UL,_Analyser::Static::ZXSpectrum::Target_*,_false>._M_head_impl._0_4_ = 1;
    std::
    unique_ptr<Analyser::Static::ZXSpectrum::Target,_std::default_delete<Analyser::Static::ZXSpectrum::Target>_>
    ::~unique_ptr((unique_ptr<Analyser::Static::ZXSpectrum::Target,_std::default_delete<Analyser::Static::ZXSpectrum::Target>_>
                   *)&state);
  }
  else {
    std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>::
    unique_ptr<std::default_delete<Analyser::Static::Target>,void>
              ((unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>> *
               )this,(nullptr_t)0x0);
    result._M_t.
    super___uniq_ptr_impl<Analyser::Static::ZXSpectrum::Target,_std::default_delete<Analyser::Static::ZXSpectrum::Target>_>
    ._M_t.
    super__Tuple_impl<0UL,_Analyser::Static::ZXSpectrum::Target_*,_std::default_delete<Analyser::Static::ZXSpectrum::Target>_>
    .super__Head_base<0UL,_Analyser::Static::ZXSpectrum::Target_*,_false>._M_head_impl._0_4_ = 1;
  }
  FileHolder::~FileHolder((FileHolder *)local_100);
  return (__uniq_ptr_data<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>,_true,_true>
          )(__uniq_ptr_data<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Analyser::Static::Target> SNA::load(const std::string &file_name) {
	// Make sure the file is accessible and appropriately sized.
	FileHolder file(file_name);
	if(file.stats().st_size != 48*1024 + 0x1b) {
		return nullptr;
	}

	// SNAs are always for 48kb machines.
	using Target = Analyser::Static::ZXSpectrum::Target;
	auto result = std::make_unique<Target>();
	result->model = Target::Model::FortyEightK;

	// Prepare to populate ZX Spectrum state.
	auto *const state = new Sinclair::ZXSpectrum::State();
	result->state = std::unique_ptr<Reflection::Struct>(state);

	// Comments below: [offset] [contents]

	//	00	I
	const uint8_t i = file.get8();

	//	01	HL';	03	DE';	05	BC';	07	AF'
	state->z80.registers.hl_dash = file.get16le();
	state->z80.registers.de_dash = file.get16le();
	state->z80.registers.bc_dash = file.get16le();
	state->z80.registers.af_dash = file.get16le();

	//	09	HL;		0B	DE;		0D	BC;		0F	IY;		11	IX
	state->z80.registers.hl = file.get16le();
	state->z80.registers.de = file.get16le();
	state->z80.registers.bc = file.get16le();
	state->z80.registers.iy = file.get16le();
	state->z80.registers.ix = file.get16le();

	//	13	IFF2 (in bit 2)
	const uint8_t iff = file.get8();
	state->z80.registers.iff1 = state->z80.registers.iff2 = iff & 4;

	//	14	R
	const uint8_t r = file.get8();
	state->z80.registers.ir = uint16_t((i << 8) | r);

	//	15	AF;		17	SP;		19	interrupt mode
	state->z80.registers.flags = file.get8();
	state->z80.registers.a = file.get8();
	state->z80.registers.stack_pointer = file.get16le();
	state->z80.registers.interrupt_mode = file.get8();

	//	1A	border colour
	state->video.border_colour = file.get8();

	//	1B–	48kb RAM contents
	state->ram = file.read(48*1024);

	// To establish program counter, point it to a RET that
	// I know is in the 16/48kb ROM. This avoids having to
	// try to do a pop here, given that the true program counter
	// might currently be in the ROM.
	state->z80.registers.program_counter = 0x1d83;

	return result;
}